

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalForcesContIntDamping
          (ChElementShellANCF_3443 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_0,__1,__1> *xpr;
  double *scalar;
  RhsNested pMVar1;
  ChElementShellANCF_3443 *pCVar2;
  Index startCol;
  ulong uVar3;
  ChElementShellANCF_3443 *this_00;
  ChMatrixNM<double,_6,_6> D;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP E_BlockDamping;
  VectorNIP SPK2_4_Block;
  VectorNIP E4_Block;
  VectorNIP E5_Block;
  VectorNIP E3_Block;
  VectorNIP E2_Block;
  VectorNIP E1_Block;
  VectorNIP E6_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  Map<Eigen::Matrix<double,_48,_1,_0,_48,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  long local_3318;
  undefined1 local_32c0 [24];
  RhsNested pMStack_32a8;
  XprTypeNested pMStack_32a0;
  variable_if_dynamic<long,__1> vStack_3298;
  scalar_constant_op<double> sStack_3290;
  RhsNested local_3288;
  Matrix<double,_32,_1,_0,_32,_1> *local_3280;
  Layer *local_3270;
  XprTypeNested local_3260;
  variable_if_dynamic<long,__1> local_3258;
  variable_if_dynamic<long,__1> local_3250;
  Index local_3248;
  PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *local_3240;
  Layer *local_3228;
  XprTypeNested local_3218;
  variable_if_dynamic<long,__1> local_3210;
  scalar_constant_op<double> local_3208;
  RhsNested local_3200;
  Matrix<double,_32,_1,_0,_32,_1> *local_31f8;
  Index local_31b0;
  double *local_31a8;
  Matrix<double,__1,__1,_1,__1,__1> *local_31a0;
  ChElementShellANCF_3443 *local_3198;
  undefined1 local_3190 [16];
  scalar_constant_op<double> sStack_3180;
  variable_if_dynamic<long,__1> vStack_3178;
  scalar_constant_op<double> sStack_3170;
  scalar_constant_op<double> sStack_3168;
  RhsNested local_3150;
  scalar_constant_op<double> local_3148;
  ChVectorDynamic<> *local_30c0;
  double *local_30b8;
  double *local_30b0;
  double *local_30a8;
  double *local_30a0;
  double *local_3098;
  double *local_3090;
  PointerType *local_3088;
  double *local_3080;
  double *local_3078;
  double *local_3070;
  ulong local_3068;
  ChMatrixNM<double,_6,_6> local_3060;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_2f28;
  undefined1 local_2f00 [8];
  undefined1 auStack_2ef8 [96];
  ChLoadableUV local_2e98;
  pointer local_2e90;
  Layer *local_2e88;
  pointer local_2e80;
  ChLoadableUV local_2e78;
  scalar_constant_op<double> local_2e70;
  RhsNested local_2e68;
  ChLoadableUV local_2e60;
  Layer *local_2e58;
  double local_2e50;
  ChLoadableUV local_2e48;
  scalar_constant_op<double> local_2e40;
  RhsNested local_2e38;
  ChLoadableUV local_2e30;
  double local_2e28;
  double local_2e20;
  double *local_2e18;
  ChLoadableUV local_2e08;
  PointerType local_2e00;
  double local_2df8;
  ChLoadableUV local_2df0;
  double *local_2de8;
  scalar_constant_op<double> local_2de0;
  ChLoadableUV local_2dd8;
  undefined1 *local_2dd0;
  double local_2dc8;
  ChLoadableUV local_2dc0;
  double local_2db8;
  double local_2db0;
  double local_2da8;
  ChLoadableUV local_2d90;
  ChLoadableUV local_2d80;
  double local_2d78;
  double dStack_2d70;
  double local_2d68;
  Matrix<double,_32,_1,_0,_32,_1> *local_2d60;
  ChLoadableUV local_2d50;
  double local_2d48;
  double local_2d40;
  double local_2d38;
  Layer *local_2d20;
  ChLoadableUV local_2d10;
  double local_2d08;
  double local_2d00;
  double local_2cf8;
  double *local_2cf0;
  ChLoadableUV local_2ce0;
  double local_2cd8;
  double local_2cd0;
  double local_2cc8;
  double *local_2cb0;
  ChLoadableUV local_2ca0;
  double local_2c98;
  double local_2c90;
  double local_2c88;
  undefined1 *local_2c80;
  ChLoadableUV local_2c70;
  double local_2c68;
  double local_2c60;
  double local_2c58;
  double adStack_2c00 [32];
  double adStack_2b00 [32];
  double adStack_2a00 [32];
  double adStack_2900 [32];
  double adStack_2800 [32];
  double adStack_2700 [39];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_25c8;
  undefined1 local_25a0 [64];
  double local_2560;
  RhsNested local_2558;
  undefined1 local_2540 [24];
  RhsNested local_2528;
  scalar_constant_op<double> local_2520;
  RhsNested local_2500;
  scalar_constant_op<double> local_24f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_24a8;
  Matrix<double,_32,_1,_0,_32,_1> local_2480;
  Matrix<double,_32,_1,_0,_32,_1> local_2380;
  PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> local_2280 [256];
  Matrix<double,_32,_1,_0,_32,_1> local_2180;
  PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> local_2080 [256];
  PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> local_1f80 [256];
  PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> local_1e80 [256];
  PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> local_1d80 [256];
  PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> local_1c80 [264];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_1b78;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_1b50;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_1b28;
  PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> local_1b00 [256];
  Matrix<double,_32,_1,_0,_32,_1> local_1a00;
  Matrix<double,_32,_1,_0,_32,_1> local_1900;
  Matrix<double,_32,_1,_0,_32,_1> local_1800;
  undefined1 local_1700 [512];
  Matrix<double,_32,_1,_0,_32,_1> local_1500;
  shared_ptr<chrono::fea::ChNodeFEAxyzDDD> local_1400 [16];
  Layer local_1300 [8];
  Layer local_1200 [8];
  double local_1100 [32];
  double local_1000 [32];
  double local_f00 [32];
  Matrix<double,_32,_1,_0,_32,_1> local_e00;
  Matrix<double,_32,_1,_0,_32,_1> local_d00;
  Matrix<double,_32,_1,_0,_32,_1> local_c00;
  double local_b00 [32];
  double local_a00 [32];
  double local_900 [32];
  undefined1 local_800 [256];
  undefined1 local_700 [256];
  undefined1 local_600 [256];
  DenseBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_> local_500 [384];
  MatrixNx6 local_380;
  
  local_30c0 = Fi;
  CalcCombinedCoordMatrix(this,&local_380);
  Eigen::DenseBase<Eigen::Matrix<double,_16,_3,_1,_16,_3>_>::setZero(local_500);
  local_3318 = 0;
  local_31a0 = &this->m_SD;
  local_3070 = adStack_2c00;
  local_3078 = adStack_2900;
  local_3098 = adStack_2b00;
  scalar = &this->m_Alpha;
  local_30a0 = adStack_2800;
  pMVar1 = (RhsNested)(local_1700 + 0x100);
  local_30a8 = &local_2d00;
  local_3080 = local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x1a;
  local_30b0 = adStack_2a00;
  local_3090 = local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x20;
  local_3088 = &local_2e00;
  xpr = &this->m_kGQ;
  local_31a8 = &local_2d78;
  local_30b8 = adStack_2700;
  startCol = 0;
  uVar3 = 0;
  local_3198 = this;
  while (uVar3 < (ulong)(long)local_3198->m_numLayers) {
    local_31b0 = startCol;
    local_3068 = uVar3;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_16,_96,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false> *)&local_3060,
               local_31a0,0,startCol);
    auStack_2ef8._40_8_ = &local_380;
    auStack_2ef8._24_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[4];
    auStack_2ef8._32_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[5];
    local_2f00 = (undefined1  [8])
                 local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0];
    auStack_2ef8._0_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    auStack_2ef8._8_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    auStack_2ef8._16_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[3];
    Eigen::PlainObjectBase<Eigen::Matrix<double,96,6,0,96,6>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,16,96,false>>,Eigen::Matrix<double,16,6,1,16,6>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,96,6,0,96,6>> *)local_1700,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>,_Eigen::Matrix<double,_16,_6,_1,_16,_6>,_0>_>
                *)local_2f00);
    auStack_2ef8._32_8_ = 0.0;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._56_8_ = &local_e00;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x0;
    auStack_2ef8._88_8_ = 1.48219693752374e-323;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 0.0;
    local_2e58 = (Layer *)local_b00;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 0.0;
    local_2e38 = (RhsNested)0x4;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x0;
    local_2de8 = (double *)local_800;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x0;
    local_2dc8 = 2.47032822920623e-323;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._8_8_ = local_1700;
    auStack_2ef8._24_8_ = local_1700;
    auStack_2ef8._72_8_ = local_1700;
    local_2e88 = (Layer *)local_1400;
    local_2e78 = (ChLoadableUV)local_1700;
    local_2e48 = (ChLoadableUV)local_1700;
    local_2e18 = local_1100;
    local_2e08 = (ChLoadableUV)local_1700;
    local_2dd8 = (ChLoadableUV)local_1700;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              (local_2280,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    auStack_2ef8._32_8_ = 0.0;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x0;
    auStack_2ef8._88_8_ = 0.0;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 0.0;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 0.0;
    local_2e38 = (RhsNested)0x1;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x0;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x0;
    local_2dc8 = 9.88131291682493e-324;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._8_8_ = local_1700;
    auStack_2ef8._24_8_ = local_1700;
    auStack_2ef8._56_8_ = local_1700;
    auStack_2ef8._72_8_ = local_1700;
    local_2e88 = (Layer *)local_1400;
    local_2e78 = (ChLoadableUV)local_1700;
    local_2e58 = (Layer *)local_1400;
    local_2e48 = (ChLoadableUV)local_1700;
    local_2e18 = local_1100;
    local_2e08 = (ChLoadableUV)local_1700;
    local_2de8 = local_1100;
    local_2dd8 = (ChLoadableUV)local_1700;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              (local_1c80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    local_2f00 = (undefined1  [8])0x3ff0000000000000;
    local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1c80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               &local_3060,(Scalar *)local_2f00);
    local_2f00 = (undefined1  [8])0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_> *)local_1c80,(Scalar *)local_2f00
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2f00,scalar,(StorageBaseType *)local_2280);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_1c80,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_2f00);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)&local_3060,xpr,
               local_3318,0);
    auStack_2ef8._24_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[4];
    auStack_2ef8._32_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[5];
    local_2f00 = (undefined1  [8])
                 local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0];
    auStack_2ef8._0_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    auStack_2ef8._8_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    auStack_2ef8._16_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[3];
    local_32c0._0_8_ = local_1c80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_32c0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_2f00);
    auStack_2ef8._32_8_ = 1.58101006669199e-322;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._56_8_ = &local_d00;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x20;
    auStack_2ef8._88_8_ = 1.48219693752374e-323;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 1.58101006669199e-322;
    local_2e58 = (Layer *)local_a00;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 1.58101006669199e-322;
    local_2e38 = (RhsNested)0x4;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x20;
    local_2de8 = (double *)local_700;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x20;
    local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_2280;
    local_2dc8 = 2.47032822920623e-323;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._8_8_ = pMVar1;
    auStack_2ef8._24_8_ = local_1700;
    auStack_2ef8._72_8_ = local_1700;
    local_2e88 = local_1300;
    local_2e78 = (ChLoadableUV)local_1700;
    local_2e48 = (ChLoadableUV)local_1700;
    local_2e18 = local_1000;
    local_2e08 = (ChLoadableUV)local_1700;
    local_2dd8 = (ChLoadableUV)local_1700;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)&local_3060,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    auStack_2ef8._24_8_ = local_1700;
    auStack_2ef8._32_8_ = 1.58101006669199e-322;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x20;
    auStack_2ef8._88_8_ = 0.0;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 1.58101006669199e-322;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 1.58101006669199e-322;
    local_2e38 = (RhsNested)0x1;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x20;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x20;
    local_2dc8 = 9.88131291682493e-324;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._8_8_ = pMVar1;
    auStack_2ef8._56_8_ = pMVar1;
    auStack_2ef8._72_8_ = auStack_2ef8._24_8_;
    local_2e88 = local_1300;
    local_2e78 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2e58 = local_1300;
    local_2e48 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2e18 = local_1000;
    local_2e08 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2de8 = local_1000;
    local_2dd8 = (ChLoadableUV)auStack_2ef8._24_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              (local_1d80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    local_2f00 = (undefined1  [8])0x3ff0000000000000;
    local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1d80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               &local_3060,(Scalar *)local_2f00);
    local_2f00 = (undefined1  [8])0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_> *)local_1d80,(Scalar *)local_2f00
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2f00,scalar,(StorageBaseType *)local_2280);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_1d80,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_2f00);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)&local_3060,xpr,
               local_3318,0);
    auStack_2ef8._24_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[4];
    auStack_2ef8._32_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[5];
    local_2f00 = (undefined1  [8])
                 local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0];
    auStack_2ef8._0_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    auStack_2ef8._8_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    auStack_2ef8._16_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[3];
    local_32c0._0_8_ = local_1d80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_32c0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_2f00);
    auStack_2ef8._24_8_ = local_1700;
    auStack_2ef8._32_8_ = 3.16202013338398e-322;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._56_8_ = &local_c00;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x40;
    auStack_2ef8._88_8_ = 1.48219693752374e-323;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 3.16202013338398e-322;
    local_2e58 = (Layer *)local_900;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 3.16202013338398e-322;
    local_2e38 = (RhsNested)0x4;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x40;
    local_2de8 = (double *)local_600;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x40;
    local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_2280;
    local_2dc8 = 2.47032822920623e-323;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._8_8_ = &local_1500;
    auStack_2ef8._72_8_ = auStack_2ef8._24_8_;
    local_2e88 = local_1200;
    local_2e78 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2e48 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2e18 = local_f00;
    local_2e08 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2dd8 = (ChLoadableUV)auStack_2ef8._24_8_;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)&local_3060,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    auStack_2ef8._24_8_ = local_1700;
    auStack_2ef8._32_8_ = 3.16202013338398e-322;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x40;
    auStack_2ef8._88_8_ = 0.0;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 3.16202013338398e-322;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 3.16202013338398e-322;
    local_2e38 = (RhsNested)0x1;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x40;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x40;
    local_2dc8 = 9.88131291682493e-324;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._8_8_ = &local_1500;
    auStack_2ef8._56_8_ = &local_1500;
    auStack_2ef8._72_8_ = auStack_2ef8._24_8_;
    local_2e88 = local_1200;
    local_2e78 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2e58 = local_1200;
    local_2e48 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2e18 = local_f00;
    local_2e08 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2de8 = local_f00;
    local_2dd8 = (ChLoadableUV)auStack_2ef8._24_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              (local_1e80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    local_2f00 = (undefined1  [8])0x3ff0000000000000;
    local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_1e80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               &local_3060,(Scalar *)local_2f00);
    local_2f00 = (undefined1  [8])0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_> *)local_1e80,(Scalar *)local_2f00
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2f00,scalar,(StorageBaseType *)local_2280);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_1e80,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_2f00);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)&local_3060,xpr,
               local_3318,0);
    auStack_2ef8._24_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[4];
    auStack_2ef8._32_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[5];
    local_2f00 = (undefined1  [8])
                 local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0];
    auStack_2ef8._0_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    auStack_2ef8._8_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    auStack_2ef8._16_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[3];
    local_32c0._0_8_ = local_1e80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_32c0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_2f00);
    auStack_2ef8._48_8_ = local_1700;
    auStack_2ef8._56_8_ = (RhsNested)0x40;
    auStack_2ef8._64_8_ = 0.0;
    auStack_2ef8._80_8_ = &local_d00;
    auStack_2ef8._72_8_ = (ChLoadableUV)0x60;
    local_2e90 = (pointer)0x20;
    local_2e88 = (Layer *)0x3;
    local_2e80 = (pointer)0x60;
    local_2e58 = (Layer *)0x40;
    local_2e40.m_other = (double)local_a00;
    local_2e50 = 4.94065645841247e-324;
    local_2e48 = (ChLoadableUV)0x60;
    local_2e28 = 1.58101006669199e-322;
    local_2e20 = 1.97626258336499e-323;
    local_2e18 = (double *)0x60;
    local_2de8 = (double *)0x40;
    local_2dd0 = local_700;
    local_2de0.m_other = 9.88131291682493e-324;
    local_2dd8 = (ChLoadableUV)0x60;
    local_2db8 = 1.58101006669199e-322;
    local_2db0 = 2.47032822920623e-323;
    local_2da8 = 4.74303020007597e-322;
    local_2d60 = &local_c00;
    local_2d78 = 1.58101006669199e-322;
    dStack_2d70 = 0.0;
    local_2d68 = 4.74303020007597e-322;
    local_2d48 = 3.16202013338398e-322;
    local_2d40 = 1.48219693752374e-323;
    local_2cf0 = local_900;
    local_2d38 = 4.74303020007597e-322;
    local_2d08 = 1.58101006669199e-322;
    local_2d00 = 4.94065645841247e-324;
    local_2cf8 = 4.74303020007597e-322;
    local_2cd8 = 3.16202013338398e-322;
    local_2cd0 = 1.97626258336499e-323;
    local_2c80 = local_600;
    local_2cc8 = 4.74303020007597e-322;
    local_2c98 = 1.58101006669199e-322;
    local_2c90 = 9.88131291682493e-324;
    local_2c88 = 4.74303020007597e-322;
    local_2c68 = 3.16202013338398e-322;
    local_2c60 = 2.47032822920623e-323;
    local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_2280;
    local_2c58 = 4.74303020007597e-322;
    auStack_2ef8._32_8_ = &local_1500;
    local_2e98 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2e70.m_other = (double)local_1200;
    local_2e60 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2e30 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2e00 = local_f00;
    local_2df0 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2dc0 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2d90 = (ChLoadableUV)pMVar1;
    local_2d80 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2d50 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2d20 = local_1300;
    local_2d10 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2ce0 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2cb0 = local_1000;
    local_2ca0 = (ChLoadableUV)auStack_2ef8._48_8_;
    local_2c70 = (ChLoadableUV)auStack_2ef8._48_8_;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)&local_3060,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    auStack_2ef8._24_8_ = local_1700;
    auStack_2ef8._32_8_ = 1.58101006669199e-322;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x40;
    auStack_2ef8._88_8_ = 0.0;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 1.58101006669199e-322;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 3.16202013338398e-322;
    local_2e38 = (RhsNested)0x1;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x20;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x40;
    local_2dc8 = 9.88131291682493e-324;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._8_8_ = pMVar1;
    auStack_2ef8._56_8_ = &local_1500;
    auStack_2ef8._72_8_ = auStack_2ef8._24_8_;
    local_2e88 = local_1300;
    local_2e78 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2e58 = local_1200;
    local_2e48 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2e18 = local_1000;
    local_2e08 = (ChLoadableUV)auStack_2ef8._24_8_;
    local_2de8 = local_f00;
    local_2dd8 = (ChLoadableUV)auStack_2ef8._24_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              (local_2080,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2f00,scalar,(StorageBaseType *)local_2280);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_2080,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_2f00);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)&local_3060,xpr,
               local_3318,0);
    local_32c0._0_8_ = local_2080;
    auStack_2ef8._24_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[4];
    auStack_2ef8._32_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[5];
    local_2f00 = (undefined1  [8])
                 local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0];
    auStack_2ef8._0_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    auStack_2ef8._8_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    auStack_2ef8._16_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[3];
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_32c0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_2f00);
    auStack_2ef8._80_8_ = &local_e00;
    auStack_2ef8._56_8_ = (RhsNested)0x40;
    auStack_2ef8._64_8_ = 0.0;
    auStack_2ef8._72_8_ = (ChLoadableUV)0x60;
    local_2e90 = (pointer)0x0;
    local_2e88 = (Layer *)0x3;
    local_2e80 = (pointer)0x60;
    local_2e58 = (Layer *)0x40;
    local_2e40.m_other = (double)local_b00;
    local_2e50 = 4.94065645841247e-324;
    local_2e48 = (ChLoadableUV)0x60;
    local_2e28 = 0.0;
    local_2e20 = 1.97626258336499e-323;
    local_2e18 = (double *)0x60;
    local_2de8 = (double *)0x40;
    local_2dd0 = local_800;
    local_2de0.m_other = 9.88131291682493e-324;
    local_2dd8 = (ChLoadableUV)0x60;
    local_2db8 = 0.0;
    local_2db0 = 2.47032822920623e-323;
    local_2da8 = 4.74303020007597e-322;
    *local_31a8 = 0.0;
    local_31a8[1] = 0.0;
    local_2cf0 = local_900;
    local_2d68 = 4.74303020007597e-322;
    local_2d48 = 3.16202013338398e-322;
    local_2d40 = 1.48219693752374e-323;
    local_2d38 = 4.74303020007597e-322;
    local_2d08 = 0.0;
    local_2d00 = 4.94065645841247e-324;
    local_2cf8 = 4.74303020007597e-322;
    local_2cd8 = 3.16202013338398e-322;
    local_2cd0 = 1.97626258336499e-323;
    local_2cc8 = 4.74303020007597e-322;
    local_2c98 = 0.0;
    local_2c80 = local_600;
    local_2c90 = 9.88131291682493e-324;
    local_2c88 = 4.74303020007597e-322;
    local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_2280;
    local_2c68 = 3.16202013338398e-322;
    local_2c60 = 2.47032822920623e-323;
    local_2c58 = 4.74303020007597e-322;
    auStack_2ef8._32_8_ = &local_1500;
    auStack_2ef8._48_8_ = local_1700;
    local_2e98 = (ChLoadableUV)local_1700;
    local_2e70.m_other = (double)local_1200;
    local_2e60 = (ChLoadableUV)local_1700;
    local_2e30 = (ChLoadableUV)local_1700;
    local_2e00 = local_f00;
    local_2df0 = (ChLoadableUV)local_1700;
    local_2dc0 = (ChLoadableUV)local_1700;
    local_2d90 = (ChLoadableUV)local_1700;
    local_2d80 = (ChLoadableUV)local_1700;
    local_2d60 = &local_c00;
    local_2d50 = (ChLoadableUV)local_1700;
    local_2d20 = (Layer *)local_1400;
    local_2d10 = (ChLoadableUV)local_1700;
    local_2ce0 = (ChLoadableUV)local_1700;
    local_2cb0 = local_1100;
    local_2ca0 = (ChLoadableUV)local_1700;
    local_2c70 = (ChLoadableUV)local_1700;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)&local_3060,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    auStack_2ef8._32_8_ = 0.0;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x40;
    auStack_2ef8._88_8_ = 0.0;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 0.0;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 3.16202013338398e-322;
    local_2e38 = (RhsNested)0x1;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x0;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x40;
    local_2dc8 = 9.88131291682493e-324;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._8_8_ = local_1700;
    auStack_2ef8._24_8_ = local_1700;
    auStack_2ef8._56_8_ = &local_1500;
    auStack_2ef8._72_8_ = local_1700;
    local_2e88 = (Layer *)local_1400;
    local_2e78 = (ChLoadableUV)local_1700;
    local_2e58 = local_1200;
    local_2e48 = (ChLoadableUV)local_1700;
    local_2e18 = local_1100;
    local_2e08 = (ChLoadableUV)local_1700;
    local_2de8 = local_f00;
    local_2dd8 = (ChLoadableUV)local_1700;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              (local_1f80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2f00,scalar,(StorageBaseType *)local_2280);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_1f80,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_2f00);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)&local_3060,xpr,
               local_3318,0);
    auStack_2ef8._24_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[4];
    auStack_2ef8._32_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[5];
    local_2f00 = (undefined1  [8])
                 local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0];
    auStack_2ef8._0_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    auStack_2ef8._8_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    auStack_2ef8._16_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[3];
    local_32c0._0_8_ = local_1f80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_32c0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_2f00);
    auStack_2ef8._80_8_ = &local_e00;
    auStack_2ef8._56_8_ = (RhsNested)0x20;
    auStack_2ef8._64_8_ = 0.0;
    auStack_2ef8._72_8_ = (ChLoadableUV)0x60;
    local_2e90 = (pointer)0x0;
    local_2e88 = (Layer *)0x3;
    local_2e80 = (pointer)0x60;
    local_2e58 = (Layer *)0x20;
    local_2e40.m_other = (double)local_b00;
    local_2e50 = 4.94065645841247e-324;
    local_2e48 = (ChLoadableUV)0x60;
    local_2e28 = 0.0;
    local_2e20 = 1.97626258336499e-323;
    local_2e18 = (double *)0x60;
    local_2de8 = (double *)0x20;
    local_2dd0 = local_800;
    local_2de0.m_other = 9.88131291682493e-324;
    local_2dd8 = (ChLoadableUV)0x60;
    local_2db8 = 0.0;
    local_2db0 = 2.47032822920623e-323;
    local_2da8 = 4.74303020007597e-322;
    *local_31a8 = 0.0;
    local_31a8[1] = 0.0;
    local_2d68 = 4.74303020007597e-322;
    local_2cf0 = local_a00;
    local_2d48 = 1.58101006669199e-322;
    local_2d40 = 1.48219693752374e-323;
    local_2d38 = 4.74303020007597e-322;
    local_2d08 = 0.0;
    local_2d00 = 4.94065645841247e-324;
    local_2cf8 = 4.74303020007597e-322;
    local_2cd8 = 1.58101006669199e-322;
    local_2cd0 = 1.97626258336499e-323;
    local_2cc8 = 4.74303020007597e-322;
    local_2c98 = 0.0;
    local_2c80 = local_700;
    local_2c90 = 9.88131291682493e-324;
    local_2c88 = 4.74303020007597e-322;
    local_2c68 = 1.58101006669199e-322;
    local_2c60 = 2.47032822920623e-323;
    local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_2280;
    local_2c58 = 4.74303020007597e-322;
    auStack_2ef8._32_8_ = pMVar1;
    auStack_2ef8._48_8_ = local_1700;
    local_2e98 = (ChLoadableUV)local_1700;
    local_2e70.m_other = (double)local_1300;
    local_2e60 = (ChLoadableUV)local_1700;
    local_2e30 = (ChLoadableUV)local_1700;
    local_2e00 = local_1000;
    local_2df0 = (ChLoadableUV)local_1700;
    local_2dc0 = (ChLoadableUV)local_1700;
    local_2d90 = (ChLoadableUV)local_1700;
    local_2d80 = (ChLoadableUV)local_1700;
    local_2d60 = &local_d00;
    local_2d50 = (ChLoadableUV)local_1700;
    local_2d20 = (Layer *)local_1400;
    local_2d10 = (ChLoadableUV)local_1700;
    local_2ce0 = (ChLoadableUV)local_1700;
    local_2cb0 = local_1100;
    local_2ca0 = (ChLoadableUV)local_1700;
    local_2c70 = (ChLoadableUV)local_1700;
    Eigen::NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,32,1,0,32,1>,Eigen::MatrixBase> *)&local_3060,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    auStack_2ef8._8_8_ = local_1700;
    auStack_2ef8._32_8_ = 0.0;
    auStack_2ef8._40_8_ = (pointer)0x0;
    auStack_2ef8._48_8_ = (pointer)0x60;
    auStack_2ef8._80_8_ = (ChLoadableUVW)0x20;
    auStack_2ef8._88_8_ = 0.0;
    local_2e98 = (ChLoadableUV)0x60;
    local_2e70.m_other = 0.0;
    local_2e68 = (RhsNested)0x1;
    local_2e60 = (ChLoadableUV)0x60;
    local_2e40.m_other = 1.58101006669199e-322;
    local_2e38 = (RhsNested)0x1;
    local_2e30 = (ChLoadableUV)0x60;
    local_2e00 = (PointerType)0x0;
    local_2df8 = 9.88131291682493e-324;
    local_2df0 = (ChLoadableUV)0x60;
    local_2dd0 = (undefined1 *)0x20;
    local_2dc8 = 9.88131291682493e-324;
    local_2dc0 = (ChLoadableUV)0x60;
    auStack_2ef8._24_8_ = auStack_2ef8._8_8_;
    auStack_2ef8._56_8_ = pMVar1;
    auStack_2ef8._72_8_ = auStack_2ef8._8_8_;
    local_2e88 = (Layer *)local_1400;
    local_2e78 = (ChLoadableUV)auStack_2ef8._8_8_;
    local_2e58 = local_1300;
    local_2e48 = (ChLoadableUV)auStack_2ef8._8_8_;
    local_2e18 = local_1100;
    local_2e08 = (ChLoadableUV)auStack_2ef8._8_8_;
    local_2de8 = local_1000;
    local_2dd8 = (ChLoadableUV)auStack_2ef8._8_8_;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const>const>>
              (local_1b00,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>_>_>_>
                *)local_2f00);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2f00,scalar,(StorageBaseType *)local_2280);
    Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_1b00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_2f00);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)&local_3060,xpr,
               local_3318,0);
    auStack_2ef8._24_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[4];
    auStack_2ef8._32_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[5];
    local_2f00 = (undefined1  [8])
                 local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[0];
    auStack_2ef8._0_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[1];
    auStack_2ef8._8_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[2];
    auStack_2ef8._16_8_ =
         local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
         array[3];
    local_32c0._0_8_ = local_1b00;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_32c0,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_2f00);
    pCVar2 = local_3198;
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               local_2f00,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((local_3198->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_material).
                       super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + local_3318));
    memcpy(&local_3060,
           (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)((long)local_2f00 + 0x20),0x120);
    this_00 = (ChElementShellANCF_3443 *)auStack_2ef8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    RotateReorderStiffnessMatrix
              (this_00,&local_3060,
               *(double *)
                ((long)&((pCVar2->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_theta + local_3318));
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_2380,(double *)&local_3060,(StorageBaseType *)local_1c80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_2480,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 1,(StorageBaseType *)local_1d80);
    local_2180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = local_2380.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[2];
    local_2180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = local_2380.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[3];
    local_2180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [8] = local_2480.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[2];
    local_2180.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [9] = local_2480.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[3];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_3190,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 2,(StorageBaseType *)local_1e80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1a00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2180,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_3190);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2540,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 3,(StorageBaseType *)local_2080);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1900,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_1a00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2540);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_25a0,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 4,(StorageBaseType *)local_1f80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_1900,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_25a0);
    Eigen::operator*(&local_2f28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 5,(StorageBaseType *)local_1b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2f00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2f28);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_1800,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_2f00);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_2480,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 6,(StorageBaseType *)local_1c80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_3190,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 7,(StorageBaseType *)local_1d80);
    local_2380.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = local_2480.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[2];
    local_2380.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = local_2480.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[3];
    local_2380.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [8] = sStack_3180.m_other;
    local_2380.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [9] = (double)vStack_3178.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2540,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 8,(StorageBaseType *)local_1e80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2180,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2380,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2540);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_25a0,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 9,(StorageBaseType *)local_2080);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1a00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2180,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_25a0);
    Eigen::operator*(&local_2f28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 10,(StorageBaseType *)local_1f80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_1a00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2f28);
    Eigen::operator*(&local_25c8,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb,(StorageBaseType *)local_1b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2f00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_25c8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_1900,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_2f00);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_3190,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc,(StorageBaseType *)local_1c80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2540,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd,(StorageBaseType *)local_1d80);
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = sStack_3180.m_other;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_3178.m_value;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [8] = (double)local_2540._16_8_;
    local_2480.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [9] = (double)local_2528;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_25a0,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe,(StorageBaseType *)local_1e80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2380,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2480,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_25a0);
    Eigen::operator*(&local_2f28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf,(StorageBaseType *)local_2080);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2180,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2380,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2f28);
    Eigen::operator*(&local_25c8,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x10,(StorageBaseType *)local_1f80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2180,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_25c8);
    Eigen::operator*(&local_24a8,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x11,(StorageBaseType *)local_1b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2f00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_24a8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_1a00,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_2f00);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_2540,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x12,(StorageBaseType *)local_1c80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_25a0,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x13,(StorageBaseType *)local_1d80);
    vStack_3178.m_value = local_2540._16_8_;
    sStack_3170.m_other = (double)local_2528;
    local_3150 = (RhsNested)local_25a0._16_8_;
    local_3148.m_other = (double)local_25a0._24_8_;
    Eigen::operator*(&local_2f28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x14,(StorageBaseType *)local_1e80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2480,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_3190,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2f28);
    Eigen::operator*(&local_25c8,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x15,(StorageBaseType *)local_2080);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2380,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2480,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_25c8);
    Eigen::operator*(&local_24a8,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x16,(StorageBaseType *)local_1f80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2380,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_24a8);
    Eigen::operator*(&local_1b28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x17,(StorageBaseType *)local_1b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2f00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1b28);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2180,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_2f00);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_25a0,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18,(StorageBaseType *)local_1c80);
    Eigen::operator*(&local_2f28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x19,(StorageBaseType *)local_1d80);
    local_2528 = (RhsNested)local_25a0._16_8_;
    local_2520.m_other = (double)local_25a0._24_8_;
    local_2500 = (RhsNested)local_2f28.m_lhs.m_functor.m_other;
    local_24f8.m_other = (double)local_2f28.m_rhs;
    Eigen::operator*(&local_25c8,local_3080,(StorageBaseType *)local_1e80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_3190,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_2540,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_25c8);
    Eigen::operator*(&local_24a8,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1b,(StorageBaseType *)local_2080);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_2480,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_3190,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_24a8);
    Eigen::operator*(&local_1b28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1c,(StorageBaseType *)local_1f80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_2480,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1b28);
    Eigen::operator*(&local_1b50,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1d,(StorageBaseType *)local_1b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2f00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1b50);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2380,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_2f00);
    Eigen::operator*(&local_2f28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1e,(StorageBaseType *)local_1c80);
    Eigen::operator*(&local_25c8,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1f,(StorageBaseType *)local_1d80);
    local_25a0._24_8_ = local_2f28.m_lhs.m_functor.m_other;
    local_25a0._32_8_ = local_2f28.m_rhs;
    local_2560 = local_25c8.m_lhs.m_functor.m_other;
    local_2558 = local_25c8.m_rhs;
    Eigen::operator*(&local_24a8,local_3090,(StorageBaseType *)local_1e80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2540,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_25a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_24a8);
    Eigen::operator*(&local_1b28,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x21,(StorageBaseType *)local_2080);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_3190,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_2540,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1b28);
    Eigen::operator*(&local_1b50,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x22,(StorageBaseType *)local_1f80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_3190,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1b50);
    Eigen::operator*(&local_1b78,
                     local_3060.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x23,(StorageBaseType *)local_1b00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_2f00,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_32c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_1b78);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2480,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_2f00);
    vStack_3298.m_value = 0;
    sStack_3290.m_other = 0.0;
    local_3280 = &local_1800;
    local_3288 = (RhsNested)0x60;
    local_3258.m_value = 0x20;
    local_3250.m_value = 0;
    local_3248 = 0x60;
    local_3210.m_value = 0x40;
    local_3208.m_other = 0.0;
    local_31f8 = &local_2380;
    local_3200 = (RhsNested)0x60;
    vStack_3178.m_value = 0;
    sStack_3170.m_other = 0.0;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = (XprTypeNested)local_1700;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3270 = (Layer *)pMVar1;
    local_3260 = (XprTypeNested)local_1700;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2480;
    local_3228 = (Layer *)&local_1500;
    local_3218 = (XprTypeNested)local_1700;
    local_3190._0_8_ =
         (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
          *)local_2f00;
    sStack_3180.m_other = (double)local_2f00;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    vStack_3298.m_value = 0;
    local_3280 = &local_1800;
    sStack_3290.m_other = 4.94065645841247e-324;
    local_3288 = (RhsNested)0x60;
    sStack_3180.m_other = (double)local_2f00;
    local_3258.m_value = 0x20;
    local_3250.m_value = 1;
    local_3248 = 0x60;
    local_3190._0_8_ = local_3070;
    vStack_3178.m_value = 0;
    local_3210.m_value = 0x40;
    local_3208.m_other = 4.94065645841247e-324;
    local_3200 = (RhsNested)0x60;
    sStack_3170.m_other = 4.94065645841247e-324;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = local_1400;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3270 = local_1300;
    local_3260 = (XprTypeNested)local_1700;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2480;
    local_3228 = local_1200;
    local_3218 = (XprTypeNested)local_1700;
    local_31f8 = &local_2380;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    vStack_3298.m_value = 0;
    local_3280 = &local_1800;
    sStack_3290.m_other = 9.88131291682493e-324;
    local_3288 = (RhsNested)0x60;
    local_3258.m_value = 0x20;
    local_3250.m_value = 2;
    local_3248 = 0x60;
    sStack_3180.m_other = (double)local_2f00;
    local_3210.m_value = 0x40;
    local_3208.m_other = 9.88131291682493e-324;
    local_3200 = (RhsNested)0x60;
    local_3190._0_8_ = local_3078;
    vStack_3178.m_value = 0;
    sStack_3170.m_other = 9.88131291682493e-324;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = local_1100;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3270 = (Layer *)local_1000;
    local_3260 = (XprTypeNested)local_1700;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2480;
    local_3228 = (Layer *)local_f00;
    local_3218 = (XprTypeNested)local_1700;
    local_31f8 = &local_2380;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    vStack_3298.m_value = 0;
    sStack_3290.m_other = 0.0;
    local_3288 = (RhsNested)0x60;
    local_3258.m_value = 0x20;
    local_3250.m_value = 0;
    local_3248 = 0x60;
    sStack_3180.m_other = (double)local_2f00;
    local_3210.m_value = 0x40;
    local_3208.m_other = 0.0;
    local_3200 = (RhsNested)0x60;
    local_3190._0_8_ = local_3088;
    vStack_3178.m_value = 0x20;
    sStack_3170.m_other = 0.0;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = (XprTypeNested)local_1700;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3280 = &local_2480;
    local_3270 = (Layer *)pMVar1;
    local_3260 = (XprTypeNested)local_1700;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_1900;
    local_3228 = (Layer *)&local_1500;
    local_3218 = (XprTypeNested)local_1700;
    local_31f8 = &local_2180;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    vStack_3298.m_value = 0;
    local_3280 = &local_2480;
    sStack_3290.m_other = 4.94065645841247e-324;
    local_3288 = (RhsNested)0x60;
    local_3258.m_value = 0x20;
    local_3250.m_value = 1;
    local_3248 = 0x60;
    local_3210.m_value = 0x40;
    local_3208.m_other = 4.94065645841247e-324;
    local_3200 = (RhsNested)0x60;
    local_3190._0_8_ = local_3098;
    vStack_3178.m_value = 0x20;
    sStack_3170.m_other = 4.94065645841247e-324;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = local_1400;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3270 = local_1300;
    local_3260 = (XprTypeNested)local_1700;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_1900;
    local_3228 = local_1200;
    local_3218 = (XprTypeNested)local_1700;
    local_31f8 = &local_2180;
    sStack_3180.m_other = (double)local_2f00;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    vStack_3298.m_value = 0;
    local_3280 = &local_2480;
    sStack_3290.m_other = 9.88131291682493e-324;
    local_3288 = (RhsNested)0x60;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_1900;
    local_3258.m_value = 0x20;
    local_3250.m_value = 2;
    local_3248 = 0x60;
    local_3210.m_value = 0x40;
    local_3208.m_other = 9.88131291682493e-324;
    local_3200 = (RhsNested)0x60;
    local_3190._0_8_ = local_30a0;
    vStack_3178.m_value = 0x20;
    sStack_3170.m_other = 9.88131291682493e-324;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = local_1100;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3270 = (Layer *)local_1000;
    local_3260 = (XprTypeNested)local_1700;
    local_3228 = (Layer *)local_f00;
    local_3218 = (XprTypeNested)local_1700;
    local_31f8 = &local_2180;
    sStack_3180.m_other = (double)local_2f00;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    local_3280 = &local_2380;
    vStack_3298.m_value = 0;
    sStack_3290.m_other = 0.0;
    local_3288 = (RhsNested)0x60;
    sStack_3180.m_other = (double)local_2f00;
    local_3190._0_8_ = local_30a8;
    local_3258.m_value = 0x20;
    local_3250.m_value = 0;
    local_3248 = 0x60;
    local_3210.m_value = 0x40;
    local_3208.m_other = 0.0;
    vStack_3178.m_value = 0x40;
    sStack_3170.m_other = 0.0;
    local_3200 = (RhsNested)0x60;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = (XprTypeNested)local_1700;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3270 = (Layer *)pMVar1;
    local_3260 = (XprTypeNested)local_1700;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2180;
    local_3228 = (Layer *)&local_1500;
    local_3218 = (XprTypeNested)local_1700;
    local_31f8 = &local_1a00;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    vStack_3298.m_value = 0;
    local_3280 = &local_2380;
    sStack_3290.m_other = 4.94065645841247e-324;
    local_3288 = (RhsNested)0x60;
    local_3258.m_value = 0x20;
    local_3250.m_value = 1;
    local_3248 = 0x60;
    local_3210.m_value = 0x40;
    local_3208.m_other = 4.94065645841247e-324;
    local_3200 = (RhsNested)0x60;
    local_3190._0_8_ = local_30b0;
    vStack_3178.m_value = 0x40;
    sStack_3170.m_other = 4.94065645841247e-324;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = local_1400;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3270 = local_1300;
    local_3260 = (XprTypeNested)local_1700;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2180;
    local_3228 = local_1200;
    local_3218 = (XprTypeNested)local_1700;
    local_31f8 = &local_1a00;
    sStack_3180.m_other = (double)local_2f00;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    vStack_3298.m_value = 0;
    local_3280 = &local_2380;
    sStack_3290.m_other = 9.88131291682493e-324;
    local_3288 = (RhsNested)0x60;
    local_3240 = (PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_2180;
    local_3258.m_value = 0x20;
    local_3250.m_value = 2;
    local_3248 = 0x60;
    local_31f8 = &local_1a00;
    local_3210.m_value = 0x40;
    local_3208.m_other = 9.88131291682493e-324;
    local_3200 = (RhsNested)0x60;
    local_3190._0_8_ = local_30b8;
    vStack_3178.m_value = 0x40;
    sStack_3170.m_other = 9.88131291682493e-324;
    sStack_3168.m_other = 4.74303020007597e-322;
    local_32c0._16_8_ = local_1100;
    pMStack_32a0 = (XprTypeNested)local_1700;
    local_3270 = (Layer *)local_1000;
    local_3260 = (XprTypeNested)local_1700;
    local_3228 = (Layer *)local_f00;
    local_3218 = (XprTypeNested)local_1700;
    sStack_3180.m_other = (double)local_2f00;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,6,0,96,6>,32,1,false>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)local_3190,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_6,_0,_96,_6>,_32,_1,_false>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                *)local_32c0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_16,_96,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false> *)local_3190,
               local_31a0,0,local_31b0);
    local_2540._0_8_ = local_500;
    pMStack_32a0 = (XprTypeNested)sStack_3170.m_other;
    vStack_3298.m_value = (long)sStack_3168.m_other;
    local_32c0._0_8_ = local_3190._0_8_;
    local_32c0._8_8_ = local_3190._8_8_;
    local_32c0._16_8_ = sStack_3180.m_other;
    pMStack_32a8 = (RhsNested)vStack_3178.m_value;
    sStack_3290.m_other = (double)local_2f00;
    Eigen::NoAlias<Eigen::Matrix<double,16,3,1,16,3>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,16,3,1,16,3>,Eigen::MatrixBase> *)local_2540,
               (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>,_Eigen::Matrix<double,_96,_3,_0,_96,_3>,_0>_>
                *)local_32c0);
    local_3318 = local_3318 + 0x20;
    startCol = local_31b0 + 0x60;
    uVar3 = local_3068 + 1;
  }
  local_1700._0_8_ = local_500;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,48,1,0,48,1>,0,Eigen::Stride<0,0>>>
            (local_30c0,
             (Map<Eigen::Matrix<double,_48,_1,_0,_48,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1700);
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.  Note that the integrand for the generalize internal force vector for a straight and normalized element
    // is of order : 12 in xi, 12 in eta, and 4 in zeta. This requires GQ 7 points along the xi and eta directions and 3
    // points along the zeta direction for "Full Integration". However, very similar results can be obtained with fewer
    // GQ point in each direction, resulting in significantly fewer calculations.  Based on testing, this could be as
    // low as 4x4x2 or 3x3x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    MatrixNx3 QiCompact;
    QiCompact.setZero();

    // Loop over all of the layers summing the contribution to the generalized internal force vector from each layer
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
        // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
        // this element compared to what is used in ChMaterialShellANCF
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
        // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
        // The entries are grouped by component in block matrices (column vectors)
        // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
        //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
        //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
        //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> P_Block;

        P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

        P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

        P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

        // =============================================================================
        // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix for the current
        // layer to get the generalized force vector in matrix form (in the correct order if its calculated in row-major
        // memory layout)
        // =============================================================================

        QiCompact.noalias() += m_SD.block<NSF, 3 * NIP>(0, 3 * kl * NIP) * P_Block;
    }

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}